

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Util.cc
# Opt level: O3

void libsgp4::Util::TrimLeft(string *s)

{
  byte *pbVar1;
  byte *pbVar2;
  ulong uVar3;
  int iVar4;
  long lVar5;
  byte *pbVar6;
  byte *pbVar7;
  
  pbVar2 = (byte *)(s->_M_dataplus)._M_p;
  uVar3 = s->_M_string_length;
  pbVar1 = pbVar2 + uVar3;
  pbVar6 = pbVar2;
  if (0 < (long)uVar3 >> 2) {
    pbVar6 = pbVar2 + (uVar3 & 0xfffffffffffffffc);
    lVar5 = ((long)uVar3 >> 2) + 1;
    pbVar7 = pbVar2 + 3;
    do {
      iVar4 = isgraph((uint)pbVar7[-3]);
      if (iVar4 != 0) {
        pbVar7 = pbVar7 + -3;
        goto LAB_001090a3;
      }
      iVar4 = isgraph((uint)pbVar7[-2]);
      if (iVar4 != 0) {
        pbVar7 = pbVar7 + -2;
        goto LAB_001090a3;
      }
      iVar4 = isgraph((uint)pbVar7[-1]);
      if (iVar4 != 0) {
        pbVar7 = pbVar7 + -1;
        goto LAB_001090a3;
      }
      iVar4 = isgraph((uint)*pbVar7);
      if (iVar4 != 0) goto LAB_001090a3;
      lVar5 = lVar5 + -1;
      pbVar7 = pbVar7 + 4;
    } while (1 < lVar5);
  }
  lVar5 = (long)pbVar1 - (long)pbVar6;
  if (lVar5 == 1) {
LAB_0010907f:
    iVar4 = isgraph((uint)*pbVar6);
    pbVar7 = pbVar6;
    if (iVar4 == 0) {
      pbVar7 = pbVar1;
    }
  }
  else if (lVar5 == 2) {
LAB_0010906e:
    iVar4 = isgraph((uint)*pbVar6);
    pbVar7 = pbVar6;
    if (iVar4 == 0) {
      pbVar6 = pbVar6 + 1;
      goto LAB_0010907f;
    }
  }
  else {
    if (lVar5 != 3) goto LAB_001090c6;
    iVar4 = isgraph((uint)*pbVar6);
    pbVar7 = pbVar6;
    if (iVar4 == 0) {
      pbVar6 = pbVar6 + 1;
      goto LAB_0010906e;
    }
  }
LAB_001090a3:
  if (pbVar1 != pbVar7) {
    std::__cxx11::string::_M_erase((ulong)s,0);
    return;
  }
LAB_001090c6:
  s->_M_string_length = 0;
  *pbVar2 = 0;
  return;
}

Assistant:

void TrimLeft(std::string& s)
    {
        s.erase(s.begin(),
                std::find_if(s.begin(), s.end(), [](unsigned char c){ return std::isgraph(c) != 0; }));
    }